

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

void google::protobuf::internal::ExtensionSet::RegisterExtension
               (MessageLite *extendee,int number,FieldType type,bool is_repeated,bool is_packed)

{
  undefined3 in_register_00000011;
  int iVar1;
  undefined4 in_register_00000034;
  ExtensionInfo info;
  undefined1 local_30 [31];
  undefined8 local_11;
  undefined8 uStack_9;
  undefined1 local_1;
  
  iVar1 = CONCAT31(in_register_00000011,type);
  if (iVar1 == 0xe) {
    RegisterExtension((ExtensionSet *)local_30);
  }
  else if (iVar1 != 0xb) {
    if (iVar1 != 10) {
      local_30._15_8_ = 0;
      local_30._23_8_ = 0;
      local_11 = 0;
      uStack_9 = 0;
      local_1 = 0;
      local_30._0_8_ = extendee;
      local_30._8_4_ = number;
      local_30[0xc] = type;
      local_30[0xd] = is_repeated;
      local_30[0xe] = is_packed;
      anon_unknown_59::Register
                ((anon_unknown_59 *)local_30,(ExtensionInfo *)CONCAT44(in_register_00000034,number))
      ;
      return;
    }
    goto LAB_0027fd04;
  }
  RegisterExtension((ExtensionSet *)local_30);
LAB_0027fd04:
  RegisterExtension((ExtensionSet *)local_30);
}

Assistant:

void ExtensionSet::RegisterExtension(const MessageLite* extendee, int number,
                                     FieldType type, bool is_repeated,
                                     bool is_packed) {
  ABSL_CHECK_NE(type, WireFormatLite::TYPE_ENUM);
  ABSL_CHECK_NE(type, WireFormatLite::TYPE_MESSAGE);
  ABSL_CHECK_NE(type, WireFormatLite::TYPE_GROUP);
  ExtensionInfo info(extendee, number, type, is_repeated, is_packed);
  Register(info);
}